

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_handle.cpp
# Opt level: O2

void CATCH2_INTERNAL_TEST_8(void)

{
  return_handler<bool_(int)> *prVar1;
  bool bVar2;
  invoke_result_t<sl::functional::ConjunctionStrategy,_std::tuple<const_GenericOperation1Mock<bool,_int>_&,_const_GenericOperation1Mock<bool,_int>_&>,_int>
  iVar3;
  invoke_result_t<sl::functional::ConjunctionStrategy,_std::tuple<GenericOperation1Mock<bool,_int>_&,_GenericOperation1Mock<bool,_int>_&>,_int>
  iVar4;
  invoke_result_t<sl::functional::ConjunctionStrategy,_std::tuple<const_GenericOperation1Mock<bool,_int>_&&,_const_GenericOperation1Mock<bool,_int>_&&>,_int>
  iVar5;
  invoke_result_t<sl::functional::ConjunctionStrategy,_std::tuple<GenericOperation1Mock<bool,_int>_&&,_GenericOperation1Mock<bool,_int>_&&>,_int>
  iVar6;
  modifier_t<trompeloeil_sig_t,_trompeloeil_l_tag_type_trompeloeil_28,_int>_conflict mVar7;
  return_handler<bool_(int)> *prVar8;
  modifier_t<trompeloeil_sig_t,_trompeloeil_l_tag_type_trompeloeil_27,_int>_conflict mVar9;
  modifier_t<trompeloeil_sig_t,_trompeloeil_l_tag_type_trompeloeil_30,_int>_conflict mVar10;
  modifier_t<trompeloeil_sig_t,_trompeloeil_l_tag_type_trompeloeil_29,_int>_conflict mVar11;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  call_matcher<bool_(int),_std::tuple<int>_> *local_4c8;
  long *local_4c0;
  SourceLineInfo local_4b8;
  call_matcher<bool_(int),_std::tuple<int>_> *local_4a8;
  int local_49c;
  sequence seq;
  AssertionHandler catchAssertionHandler;
  Section local_3d0;
  GenericOperation1Mock<bool,_int> local_370;
  StringRef local_2b0;
  StringRef local_2a0;
  StringRef local_290;
  BasicClosure<sl::functional::Composition<sl::functional::ConjunctionStrategy,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
  composedFun;
  StringRef local_100;
  GenericOperation1Mock<bool,_int> local_f0;
  
  local_f0.trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_003ce860;
  local_f0.trompeloeil_l_expectations_27.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_f0.trompeloeil_l_expectations_27.saturated;
  local_f0.trompeloeil_l_expectations_27.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_003ce860;
  local_f0.trompeloeil_l_expectations_28.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_f0.trompeloeil_l_expectations_28;
  local_f0.trompeloeil_l_expectations_28.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_003ce860;
  local_f0.trompeloeil_l_expectations_28.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_f0.trompeloeil_l_expectations_28.saturated;
  local_f0.trompeloeil_l_expectations_28.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_003ce860;
  local_f0.trompeloeil_l_expectations_29.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_f0.trompeloeil_l_expectations_29;
  local_f0.trompeloeil_l_expectations_29.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_003ce860;
  local_f0.trompeloeil_l_expectations_29.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_f0.trompeloeil_l_expectations_29.saturated;
  local_f0.trompeloeil_l_expectations_29.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_003ce860;
  local_f0.trompeloeil_l_expectations_30.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_f0.trompeloeil_l_expectations_30;
  local_f0.trompeloeil_l_expectations_30.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_003ce860;
  local_f0.trompeloeil_l_expectations_30.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_f0.trompeloeil_l_expectations_30.saturated;
  local_f0.trompeloeil_l_expectations_30.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_003ce860;
  local_370.trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)&local_370;
  local_370.trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_003ce860;
  local_370.trompeloeil_l_expectations_27.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_370.trompeloeil_l_expectations_27.saturated;
  local_370.trompeloeil_l_expectations_27.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_003ce860;
  local_370.trompeloeil_l_expectations_28.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_370.trompeloeil_l_expectations_28;
  local_370.trompeloeil_l_expectations_28.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_003ce860;
  local_370.trompeloeil_l_expectations_28.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_370.trompeloeil_l_expectations_28.saturated;
  local_370.trompeloeil_l_expectations_28.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_003ce860;
  local_370.trompeloeil_l_expectations_29.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_370.trompeloeil_l_expectations_29;
  local_370.trompeloeil_l_expectations_29.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_003ce860;
  local_370.trompeloeil_l_expectations_29.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_370.trompeloeil_l_expectations_29.saturated;
  local_370.trompeloeil_l_expectations_29.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_003ce860;
  local_370.trompeloeil_l_expectations_30.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_370.trompeloeil_l_expectations_30;
  local_370.trompeloeil_l_expectations_30.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_003ce860;
  local_370.trompeloeil_l_expectations_30.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_370.trompeloeil_l_expectations_30.saturated;
  local_370.trompeloeil_l_expectations_30.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_003ce860;
  seq.obj._M_t.
  super___uniq_ptr_impl<trompeloeil::sequence_type,_std::default_delete<trompeloeil::sequence_type>_>
  ._M_t.
  super__Tuple_impl<0UL,_trompeloeil::sequence_type_*,_std::default_delete<trompeloeil::sequence_type>_>
  .super__Head_base<0UL,_trompeloeil::sequence_type_*,_false>._M_head_impl =
       (unique_ptr<trompeloeil::sequence_type,_std::default_delete<trompeloeil::sequence_type>_>)
       (__uniq_ptr_data<trompeloeil::sequence_type,_std::default_delete<trompeloeil::sequence_type>,_true,_true>
        )0x0;
  local_370.trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_370.trompeloeil_l_expectations_27.active.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_370.trompeloeil_l_expectations_27.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_370.trompeloeil_l_expectations_27.saturated.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_370.trompeloeil_l_expectations_28.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_370.trompeloeil_l_expectations_28.active.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_370.trompeloeil_l_expectations_28.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_370.trompeloeil_l_expectations_28.saturated.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_370.trompeloeil_l_expectations_29.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_370.trompeloeil_l_expectations_29.active.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_370.trompeloeil_l_expectations_29.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_370.trompeloeil_l_expectations_29.saturated.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_370.trompeloeil_l_expectations_30.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_370.trompeloeil_l_expectations_30.active.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_370.trompeloeil_l_expectations_30.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_370.trompeloeil_l_expectations_30.saturated.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_f0.trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)&local_f0;
  local_f0.trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)&local_f0;
  local_f0.trompeloeil_l_expectations_27.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_f0.trompeloeil_l_expectations_27.saturated.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_f0.trompeloeil_l_expectations_28.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_f0.trompeloeil_l_expectations_28.active.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_f0.trompeloeil_l_expectations_28.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_f0.trompeloeil_l_expectations_28.saturated.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_f0.trompeloeil_l_expectations_29.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_f0.trompeloeil_l_expectations_29.active.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_f0.trompeloeil_l_expectations_29.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_f0.trompeloeil_l_expectations_29.saturated.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_f0.trompeloeil_l_expectations_30.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_f0.trompeloeil_l_expectations_30.active.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_f0.trompeloeil_l_expectations_30.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_f0.trompeloeil_l_expectations_30.saturated.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  std::make_unique<trompeloeil::sequence_type>();
  composedFun.m_Fn.m_Functions.
  super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
  super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
  super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
  trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)anon_var_dwarf_52d5fd;
  composedFun.m_Fn.m_Functions.
  super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
  super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
  super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
  trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x4b;
  Catch::StringRef::StringRef(&local_100,"Invoking as const lvalue ref.");
  Catch::Section::Section(&local_3d0,(SourceLineInfo *)&composedFun,local_100,(char *)0x0);
  bVar2 = Catch::Section::operator_cast_to_bool(&local_3d0);
  if (bVar2) {
    composedFun.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
         (_func_int **)anon_var_dwarf_52d5fd;
    composedFun.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x4d;
    composedFun.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)anon_var_dwarf_48e4cb;
    local_4a8 = (call_matcher<bool_(int),_std::tuple<int>_> *)CONCAT44(local_4a8._4_4_,0x2a);
    local_4b8.file = (char *)&local_f0;
    mVar7 = GenericOperation1Mock<bool,_int>::trompeloeil_l_tag_type_trompeloeil_28::
            call_const_lvalue_ref<int>
                      ((trompeloeil_l_tag_type_trompeloeil_28 *)&composedFun,(int *)&local_4a8);
    prVar8 = (return_handler<bool_(int)> *)operator_new(0x10);
    prVar8->_vptr_return_handler = (_func_int **)&PTR__return_handler_003d23a0;
    prVar1 = ((mVar7.matcher)->return_handler_obj)._M_t.
             super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl;
    ((mVar7.matcher)->return_handler_obj)._M_t.
    super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl = prVar8;
    if (prVar1 != (return_handler<bool_(int)> *)0x0) {
      (*prVar1->_vptr_return_handler[1])();
    }
    catchAssertionHandler.m_assertionInfo.macroName.m_start = "seq";
    catchAssertionHandler.m_assertionInfo.macroName.m_size = (size_type)&seq;
    trompeloeil::call_matcher<bool(int),std::tuple<int>>::
    set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
              ((call_matcher<bool(int),std::tuple<int>> *)mVar7.matcher,
               (pair<const_char_*,_trompeloeil::sequence_&> *)&catchAssertionHandler);
    local_4c8 = mVar7.matcher;
    trompeloeil::call_validator_t<GenericOperation1Mock<bool,int>const&>::
    make_expectation<trompeloeil::call_matcher<bool(int),std::tuple<int>>,GenericOperation1Mock<bool,int>::trompeloeil_l_tag_type_trompeloeil_28,trompeloeil::sequence_injector<trompeloeil::return_injector<bool,trompeloeil::matcher_info<bool(int)>>>>
              ((call_validator_t<GenericOperation1Mock<bool,int>const&> *)&local_4c0,&local_4b8);
    local_4b8.file = (char *)&local_370;
    composedFun.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
         (_func_int **)anon_var_dwarf_52d5fd;
    composedFun.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x51;
    composedFun.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)anon_var_dwarf_48e4e1;
    local_49c = 0x2a;
    mVar7 = GenericOperation1Mock<bool,_int>::trompeloeil_l_tag_type_trompeloeil_28::
            call_const_lvalue_ref<int>
                      ((trompeloeil_l_tag_type_trompeloeil_28 *)&composedFun,&local_49c);
    prVar8 = (return_handler<bool_(int)> *)operator_new(0x10);
    prVar8->_vptr_return_handler = (_func_int **)&PTR__return_handler_003d23e0;
    prVar1 = ((mVar7.matcher)->return_handler_obj)._M_t.
             super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl;
    ((mVar7.matcher)->return_handler_obj)._M_t.
    super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl = prVar8;
    if (prVar1 != (return_handler<bool_(int)> *)0x0) {
      (*prVar1->_vptr_return_handler[1])();
    }
    catchAssertionHandler.m_assertionInfo.macroName.m_start = "seq";
    catchAssertionHandler.m_assertionInfo.macroName.m_size = (size_type)&seq;
    trompeloeil::call_matcher<bool(int),std::tuple<int>>::
    set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
              ((call_matcher<bool(int),std::tuple<int>> *)mVar7.matcher,
               (pair<const_char_*,_trompeloeil::sequence_&> *)&catchAssertionHandler);
    local_4a8 = mVar7.matcher;
    trompeloeil::call_validator_t<GenericOperation1Mock<bool,int>const&>::
    make_expectation<trompeloeil::call_matcher<bool(int),std::tuple<int>>,GenericOperation1Mock<bool,int>::trompeloeil_l_tag_type_trompeloeil_28,trompeloeil::sequence_injector<trompeloeil::return_injector<bool,trompeloeil::matcher_info<bool(int)>>>>
              ((call_validator_t<GenericOperation1Mock<bool,int>const&> *)&local_4c8,&local_4b8);
    GenericOperation1Mock<bool,_int>::GenericOperation1Mock
              ((GenericOperation1Mock<bool,_int> *)&catchAssertionHandler,&local_f0);
    sl::functional::operator&&<GenericOperation1Mock<bool,_int>_>
              (&composedFun,
               (BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
                *)&catchAssertionHandler,&local_370);
    GenericOperation1Mock<bool,_int>::~GenericOperation1Mock
              ((GenericOperation1Mock<bool,_int> *)&catchAssertionHandler);
    catchAssertionHandler.m_assertionInfo.macroName.m_start =
         (char *)CONCAT44(catchAssertionHandler.m_assertionInfo.macroName.m_start._4_4_,0x2a);
    iVar3 = sl::functional::
            Composition<sl::functional::ConjunctionStrategy,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>
            ::operator()<int>(&composedFun.m_Fn,(int *)&catchAssertionHandler);
    local_4b8.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/functional/mixins/Conjunction.cpp"
    ;
    local_4b8.line = 0x5a;
    macroName.m_size = 7;
    macroName.m_start = "REQUIRE";
    capturedExpression.m_size = 7;
    capturedExpression.m_start = "!result";
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,macroName,&local_4b8,capturedExpression,Normal);
    local_4b8.file = (char *)CONCAT71(local_4b8.file._1_7_,!iVar3);
    Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_4b8);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    std::_Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>::
    ~_Tuple_impl((_Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>
                  *)&composedFun);
    if (local_4c8 != (call_matcher<bool_(int),_std::tuple<int>_> *)0x0) {
      (*(local_4c8->super_call_matcher_base<bool_(int)>).
        super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem[1])();
    }
    if (local_4c0 != (long *)0x0) {
      (**(code **)(*local_4c0 + 8))();
    }
  }
  Catch::Section::~Section(&local_3d0);
  composedFun.m_Fn.m_Functions.
  super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
  super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
  super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
  trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)anon_var_dwarf_52d5fd;
  composedFun.m_Fn.m_Functions.
  super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
  super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
  super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
  trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x5d;
  Catch::StringRef::StringRef(&local_290,"Invoking as lvalue ref.");
  Catch::Section::Section(&local_3d0,(SourceLineInfo *)&composedFun,local_290,(char *)0x0);
  bVar2 = Catch::Section::operator_cast_to_bool(&local_3d0);
  if (bVar2) {
    composedFun.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
         (_func_int **)anon_var_dwarf_52d5fd;
    composedFun.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x5f;
    composedFun.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)anon_var_dwarf_48e501;
    local_4a8 = (call_matcher<bool_(int),_std::tuple<int>_> *)CONCAT44(local_4a8._4_4_,0x2a);
    local_4b8.file = (char *)&local_f0;
    mVar9 = GenericOperation1Mock<bool,_int>::trompeloeil_l_tag_type_trompeloeil_27::
            call_lvalue_ref<int>
                      ((trompeloeil_l_tag_type_trompeloeil_27 *)&composedFun,(int *)&local_4a8);
    prVar8 = (return_handler<bool_(int)> *)operator_new(0x10);
    prVar8->_vptr_return_handler = (_func_int **)&PTR__return_handler_003d2420;
    prVar1 = ((mVar9.matcher)->return_handler_obj)._M_t.
             super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl;
    ((mVar9.matcher)->return_handler_obj)._M_t.
    super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl = prVar8;
    if (prVar1 != (return_handler<bool_(int)> *)0x0) {
      (*prVar1->_vptr_return_handler[1])();
    }
    catchAssertionHandler.m_assertionInfo.macroName.m_start = "seq";
    catchAssertionHandler.m_assertionInfo.macroName.m_size = (size_type)&seq;
    trompeloeil::call_matcher<bool(int),std::tuple<int>>::
    set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
              ((call_matcher<bool(int),std::tuple<int>> *)mVar9.matcher,
               (pair<const_char_*,_trompeloeil::sequence_&> *)&catchAssertionHandler);
    local_4c8 = mVar9.matcher;
    trompeloeil::call_validator_t<GenericOperation1Mock<bool,int>&>::
    make_expectation<trompeloeil::call_matcher<bool(int),std::tuple<int>>,GenericOperation1Mock<bool,int>::trompeloeil_l_tag_type_trompeloeil_27,trompeloeil::sequence_injector<trompeloeil::return_injector<bool,trompeloeil::matcher_info<bool(int)>>>>
              ((call_validator_t<GenericOperation1Mock<bool,int>&> *)&local_4c0,&local_4b8);
    local_4b8.file = (char *)&local_370;
    composedFun.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
         (_func_int **)anon_var_dwarf_52d5fd;
    composedFun.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x63;
    composedFun.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)anon_var_dwarf_48e50b;
    local_49c = 0x2a;
    mVar9 = GenericOperation1Mock<bool,_int>::trompeloeil_l_tag_type_trompeloeil_27::
            call_lvalue_ref<int>((trompeloeil_l_tag_type_trompeloeil_27 *)&composedFun,&local_49c);
    prVar8 = (return_handler<bool_(int)> *)operator_new(0x10);
    prVar8->_vptr_return_handler = (_func_int **)&PTR__return_handler_003d2460;
    prVar1 = ((mVar9.matcher)->return_handler_obj)._M_t.
             super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl;
    ((mVar9.matcher)->return_handler_obj)._M_t.
    super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl = prVar8;
    if (prVar1 != (return_handler<bool_(int)> *)0x0) {
      (*prVar1->_vptr_return_handler[1])();
    }
    catchAssertionHandler.m_assertionInfo.macroName.m_start = "seq";
    catchAssertionHandler.m_assertionInfo.macroName.m_size = (size_type)&seq;
    trompeloeil::call_matcher<bool(int),std::tuple<int>>::
    set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
              ((call_matcher<bool(int),std::tuple<int>> *)mVar9.matcher,
               (pair<const_char_*,_trompeloeil::sequence_&> *)&catchAssertionHandler);
    local_4a8 = mVar9.matcher;
    trompeloeil::call_validator_t<GenericOperation1Mock<bool,int>&>::
    make_expectation<trompeloeil::call_matcher<bool(int),std::tuple<int>>,GenericOperation1Mock<bool,int>::trompeloeil_l_tag_type_trompeloeil_27,trompeloeil::sequence_injector<trompeloeil::return_injector<bool,trompeloeil::matcher_info<bool(int)>>>>
              ((call_validator_t<GenericOperation1Mock<bool,int>&> *)&local_4c8,&local_4b8);
    GenericOperation1Mock<bool,_int>::GenericOperation1Mock
              ((GenericOperation1Mock<bool,_int> *)&catchAssertionHandler,&local_f0);
    sl::functional::operator&&<GenericOperation1Mock<bool,_int>_>
              (&composedFun,
               (BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
                *)&catchAssertionHandler,&local_370);
    GenericOperation1Mock<bool,_int>::~GenericOperation1Mock
              ((GenericOperation1Mock<bool,_int> *)&catchAssertionHandler);
    catchAssertionHandler.m_assertionInfo.macroName.m_start =
         (char *)CONCAT44(catchAssertionHandler.m_assertionInfo.macroName.m_start._4_4_,0x2a);
    iVar4 = sl::functional::
            Composition<sl::functional::ConjunctionStrategy,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>
            ::operator()<int>(&composedFun.m_Fn,(int *)&catchAssertionHandler);
    local_4b8.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/functional/mixins/Conjunction.cpp"
    ;
    local_4b8.line = 0x6c;
    macroName_00.m_size = 7;
    macroName_00.m_start = "REQUIRE";
    capturedExpression_00.m_size = 7;
    capturedExpression_00.m_start = "!result";
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,macroName_00,&local_4b8,capturedExpression_00,Normal);
    local_4b8.file = (char *)CONCAT71(local_4b8.file._1_7_,!iVar4);
    Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_4b8);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    std::_Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>::
    ~_Tuple_impl((_Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>
                  *)&composedFun);
    if (local_4c8 != (call_matcher<bool_(int),_std::tuple<int>_> *)0x0) {
      (*(local_4c8->super_call_matcher_base<bool_(int)>).
        super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem[1])();
    }
    if (local_4c0 != (long *)0x0) {
      (**(code **)(*local_4c0 + 8))();
    }
  }
  Catch::Section::~Section(&local_3d0);
  composedFun.m_Fn.m_Functions.
  super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
  super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
  super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
  trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)anon_var_dwarf_52d5fd;
  composedFun.m_Fn.m_Functions.
  super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
  super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
  super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
  trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x6f;
  Catch::StringRef::StringRef(&local_2a0,"Invoking as const rvalue ref.");
  Catch::Section::Section(&local_3d0,(SourceLineInfo *)&composedFun,local_2a0,(char *)0x0);
  bVar2 = Catch::Section::operator_cast_to_bool(&local_3d0);
  if (bVar2) {
    composedFun.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
         (_func_int **)anon_var_dwarf_52d5fd;
    composedFun.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x71;
    composedFun.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)anon_var_dwarf_48e52b;
    local_4a8 = (call_matcher<bool_(int),_std::tuple<int>_> *)CONCAT44(local_4a8._4_4_,0x2a);
    local_4b8.file = (char *)&local_f0;
    mVar10 = GenericOperation1Mock<bool,_int>::trompeloeil_l_tag_type_trompeloeil_30::
             call_const_rvalue_ref<int>
                       ((trompeloeil_l_tag_type_trompeloeil_30 *)&composedFun,(int *)&local_4a8);
    prVar8 = (return_handler<bool_(int)> *)operator_new(0x10);
    prVar8->_vptr_return_handler = (_func_int **)&PTR__return_handler_003d24a0;
    prVar1 = ((mVar10.matcher)->return_handler_obj)._M_t.
             super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl;
    ((mVar10.matcher)->return_handler_obj)._M_t.
    super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl = prVar8;
    if (prVar1 != (return_handler<bool_(int)> *)0x0) {
      (*prVar1->_vptr_return_handler[1])();
    }
    catchAssertionHandler.m_assertionInfo.macroName.m_start = "seq";
    catchAssertionHandler.m_assertionInfo.macroName.m_size = (size_type)&seq;
    trompeloeil::call_matcher<bool(int),std::tuple<int>>::
    set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
              ((call_matcher<bool(int),std::tuple<int>> *)mVar10.matcher,
               (pair<const_char_*,_trompeloeil::sequence_&> *)&catchAssertionHandler);
    local_4c8 = mVar10.matcher;
    trompeloeil::call_validator_t<GenericOperation1Mock<bool,int>const&>::
    make_expectation<trompeloeil::call_matcher<bool(int),std::tuple<int>>,GenericOperation1Mock<bool,int>::trompeloeil_l_tag_type_trompeloeil_30,trompeloeil::sequence_injector<trompeloeil::return_injector<bool,trompeloeil::matcher_info<bool(int)>>>>
              ((call_validator_t<GenericOperation1Mock<bool,int>const&> *)&local_4c0,&local_4b8);
    local_4b8.file = (char *)&local_370;
    composedFun.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
         (_func_int **)anon_var_dwarf_52d5fd;
    composedFun.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x75;
    composedFun.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)anon_var_dwarf_48e535;
    local_49c = 0x2a;
    mVar10 = GenericOperation1Mock<bool,_int>::trompeloeil_l_tag_type_trompeloeil_30::
             call_const_rvalue_ref<int>
                       ((trompeloeil_l_tag_type_trompeloeil_30 *)&composedFun,&local_49c);
    prVar8 = (return_handler<bool_(int)> *)operator_new(0x10);
    prVar8->_vptr_return_handler = (_func_int **)&PTR__return_handler_003d24e0;
    prVar1 = ((mVar10.matcher)->return_handler_obj)._M_t.
             super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl;
    ((mVar10.matcher)->return_handler_obj)._M_t.
    super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl = prVar8;
    if (prVar1 != (return_handler<bool_(int)> *)0x0) {
      (*prVar1->_vptr_return_handler[1])();
    }
    catchAssertionHandler.m_assertionInfo.macroName.m_start = "seq";
    catchAssertionHandler.m_assertionInfo.macroName.m_size = (size_type)&seq;
    trompeloeil::call_matcher<bool(int),std::tuple<int>>::
    set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
              ((call_matcher<bool(int),std::tuple<int>> *)mVar10.matcher,
               (pair<const_char_*,_trompeloeil::sequence_&> *)&catchAssertionHandler);
    local_4a8 = mVar10.matcher;
    trompeloeil::call_validator_t<GenericOperation1Mock<bool,int>const&>::
    make_expectation<trompeloeil::call_matcher<bool(int),std::tuple<int>>,GenericOperation1Mock<bool,int>::trompeloeil_l_tag_type_trompeloeil_30,trompeloeil::sequence_injector<trompeloeil::return_injector<bool,trompeloeil::matcher_info<bool(int)>>>>
              ((call_validator_t<GenericOperation1Mock<bool,int>const&> *)&local_4c8,&local_4b8);
    GenericOperation1Mock<bool,_int>::GenericOperation1Mock
              ((GenericOperation1Mock<bool,_int> *)&catchAssertionHandler,&local_f0);
    sl::functional::operator&&<GenericOperation1Mock<bool,_int>_>
              (&composedFun,
               (BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
                *)&catchAssertionHandler,&local_370);
    GenericOperation1Mock<bool,_int>::~GenericOperation1Mock
              ((GenericOperation1Mock<bool,_int> *)&catchAssertionHandler);
    catchAssertionHandler.m_assertionInfo.macroName.m_start =
         (char *)CONCAT44(catchAssertionHandler.m_assertionInfo.macroName.m_start._4_4_,0x2a);
    iVar5 = sl::functional::
            Composition<sl::functional::ConjunctionStrategy,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>
            ::operator()<int>(&composedFun.m_Fn,(int *)&catchAssertionHandler);
    local_4b8.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/functional/mixins/Conjunction.cpp"
    ;
    local_4b8.line = 0x7e;
    macroName_01.m_size = 7;
    macroName_01.m_start = "REQUIRE";
    capturedExpression_01.m_size = 7;
    capturedExpression_01.m_start = "!result";
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,macroName_01,&local_4b8,capturedExpression_01,Normal);
    local_4b8.file = (char *)CONCAT71(local_4b8.file._1_7_,!iVar5);
    Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_4b8);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    std::_Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>::
    ~_Tuple_impl((_Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>
                  *)&composedFun);
    if (local_4c8 != (call_matcher<bool_(int),_std::tuple<int>_> *)0x0) {
      (*(local_4c8->super_call_matcher_base<bool_(int)>).
        super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem[1])();
    }
    if (local_4c0 != (long *)0x0) {
      (**(code **)(*local_4c0 + 8))();
    }
  }
  Catch::Section::~Section(&local_3d0);
  composedFun.m_Fn.m_Functions.
  super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
  super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
  super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
  trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)anon_var_dwarf_52d5fd;
  composedFun.m_Fn.m_Functions.
  super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
  super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
  super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
  trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x81;
  Catch::StringRef::StringRef(&local_2b0,"Invoking as rvalue ref.");
  Catch::Section::Section(&local_3d0,(SourceLineInfo *)&composedFun,local_2b0,(char *)0x0);
  bVar2 = Catch::Section::operator_cast_to_bool(&local_3d0);
  if (bVar2) {
    composedFun.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
         (_func_int **)anon_var_dwarf_52d5fd;
    composedFun.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x83;
    composedFun.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)anon_var_dwarf_48e549;
    local_4a8 = (call_matcher<bool_(int),_std::tuple<int>_> *)CONCAT44(local_4a8._4_4_,0x2a);
    local_4b8.file = (char *)&local_f0;
    mVar11 = GenericOperation1Mock<bool,_int>::trompeloeil_l_tag_type_trompeloeil_29::
             call_rvalue_ref<int>
                       ((trompeloeil_l_tag_type_trompeloeil_29 *)&composedFun,(int *)&local_4a8);
    prVar8 = (return_handler<bool_(int)> *)operator_new(0x10);
    prVar8->_vptr_return_handler = (_func_int **)&PTR__return_handler_003d2520;
    prVar1 = ((mVar11.matcher)->return_handler_obj)._M_t.
             super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl;
    ((mVar11.matcher)->return_handler_obj)._M_t.
    super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl = prVar8;
    if (prVar1 != (return_handler<bool_(int)> *)0x0) {
      (*prVar1->_vptr_return_handler[1])();
    }
    catchAssertionHandler.m_assertionInfo.macroName.m_start = "seq";
    catchAssertionHandler.m_assertionInfo.macroName.m_size = (size_type)&seq;
    trompeloeil::call_matcher<bool(int),std::tuple<int>>::
    set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
              ((call_matcher<bool(int),std::tuple<int>> *)mVar11.matcher,
               (pair<const_char_*,_trompeloeil::sequence_&> *)&catchAssertionHandler);
    local_4c8 = mVar11.matcher;
    trompeloeil::call_validator_t<GenericOperation1Mock<bool,int>&>::
    make_expectation<trompeloeil::call_matcher<bool(int),std::tuple<int>>,GenericOperation1Mock<bool,int>::trompeloeil_l_tag_type_trompeloeil_29,trompeloeil::sequence_injector<trompeloeil::return_injector<bool,trompeloeil::matcher_info<bool(int)>>>>
              ((call_validator_t<GenericOperation1Mock<bool,int>&> *)&local_4c0,&local_4b8);
    local_4b8.file = (char *)&local_370;
    composedFun.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
         (_func_int **)anon_var_dwarf_52d5fd;
    composedFun.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x87;
    composedFun.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)anon_var_dwarf_48e553;
    local_49c = 0x2a;
    mVar11 = GenericOperation1Mock<bool,_int>::trompeloeil_l_tag_type_trompeloeil_29::
             call_rvalue_ref<int>((trompeloeil_l_tag_type_trompeloeil_29 *)&composedFun,&local_49c);
    prVar8 = (return_handler<bool_(int)> *)operator_new(0x10);
    prVar8->_vptr_return_handler = (_func_int **)&PTR__return_handler_003d2560;
    prVar1 = ((mVar11.matcher)->return_handler_obj)._M_t.
             super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl;
    ((mVar11.matcher)->return_handler_obj)._M_t.
    super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl = prVar8;
    if (prVar1 != (return_handler<bool_(int)> *)0x0) {
      (*prVar1->_vptr_return_handler[1])();
    }
    catchAssertionHandler.m_assertionInfo.macroName.m_start = "seq";
    catchAssertionHandler.m_assertionInfo.macroName.m_size = (size_type)&seq;
    trompeloeil::call_matcher<bool(int),std::tuple<int>>::
    set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
              ((call_matcher<bool(int),std::tuple<int>> *)mVar11.matcher,
               (pair<const_char_*,_trompeloeil::sequence_&> *)&catchAssertionHandler);
    local_4a8 = mVar11.matcher;
    trompeloeil::call_validator_t<GenericOperation1Mock<bool,int>&>::
    make_expectation<trompeloeil::call_matcher<bool(int),std::tuple<int>>,GenericOperation1Mock<bool,int>::trompeloeil_l_tag_type_trompeloeil_29,trompeloeil::sequence_injector<trompeloeil::return_injector<bool,trompeloeil::matcher_info<bool(int)>>>>
              ((call_validator_t<GenericOperation1Mock<bool,int>&> *)&local_4c8,&local_4b8);
    GenericOperation1Mock<bool,_int>::GenericOperation1Mock
              ((GenericOperation1Mock<bool,_int> *)&catchAssertionHandler,&local_f0);
    sl::functional::operator&&<GenericOperation1Mock<bool,_int>_>
              (&composedFun,
               (BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
                *)&catchAssertionHandler,&local_370);
    GenericOperation1Mock<bool,_int>::~GenericOperation1Mock
              ((GenericOperation1Mock<bool,_int> *)&catchAssertionHandler);
    catchAssertionHandler.m_assertionInfo.macroName.m_start =
         (char *)CONCAT44(catchAssertionHandler.m_assertionInfo.macroName.m_start._4_4_,0x2a);
    iVar6 = sl::functional::
            Composition<sl::functional::ConjunctionStrategy,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>
            ::operator()<int>(&composedFun.m_Fn,(int *)&catchAssertionHandler);
    local_4b8.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/functional/mixins/Conjunction.cpp"
    ;
    local_4b8.line = 0x90;
    macroName_02.m_size = 7;
    macroName_02.m_start = "REQUIRE";
    capturedExpression_02.m_size = 7;
    capturedExpression_02.m_start = "!result";
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,macroName_02,&local_4b8,capturedExpression_02,Normal);
    local_4b8.file = (char *)CONCAT71(local_4b8.file._1_7_,!iVar6);
    Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_4b8);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    std::_Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>::
    ~_Tuple_impl((_Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>
                  *)&composedFun);
    if (local_4c8 != (call_matcher<bool_(int),_std::tuple<int>_> *)0x0) {
      (*(local_4c8->super_call_matcher_base<bool_(int)>).
        super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem[1])();
    }
    if (local_4c0 != (long *)0x0) {
      (**(code **)(*local_4c0 + 8))();
    }
  }
  Catch::Section::~Section(&local_3d0);
  std::unique_ptr<trompeloeil::sequence_type,_std::default_delete<trompeloeil::sequence_type>_>::
  ~unique_ptr(&seq.obj);
  GenericOperation1Mock<bool,_int>::~GenericOperation1Mock(&local_370);
  GenericOperation1Mock<bool,_int>::~GenericOperation1Mock(&local_f0);
  return;
}

Assistant:

constexpr value_t(int a)
			: a{ a }
		{ }